

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_pasv_resp(Curl_easy *data,int ftpcode)

{
  char *pcVar1;
  undefined1 *puVar2;
  Curl_addrinfo *hostname;
  int iVar3;
  CURLcode CVar4;
  connectdata *conn;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  connectdata *conn_00;
  char *pcVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  char separator [4];
  Curl_dns_entry *addr;
  uint num;
  undefined4 local_160;
  uint auStack_15c [2];
  int local_154;
  Curl_dns_entry *local_150;
  connectdata *local_148;
  Curl_easy *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  
  conn_00 = data->conn;
  local_150 = (Curl_dns_entry *)0x0;
  pcVar11 = (data->state).buffer + 4;
  (*Curl_cfree)((conn_00->proto).ftpc.newhost);
  (conn_00->proto).ftpc.newhost = (char *)0x0;
  iVar3 = (conn_00->proto).ftpc.count1;
  if (ftpcode != 0xe5 || iVar3 != 0) {
    if (ftpcode != 0xe3 || iVar3 != 1) {
      if (iVar3 != 0) {
        Curl_failf(data,"Bad PASV/EPSV response: %03d",ftpcode);
        return CURLE_FTP_WEIRD_PASV_REPLY;
      }
      CVar4 = ftp_epsv_disable(data,conn_00);
      return CVar4;
    }
    local_138 = 0;
    uStack_130 = 0;
    _local_160 = 0;
    if (*pcVar11 == '\0') {
      bVar14 = true;
      bVar13 = false;
      bVar12 = false;
      uVar10 = 0;
      uVar9 = 0;
      uVar6 = 0;
      uVar7 = 0;
    }
    else {
      local_154 = ftpcode;
      local_148 = conn_00;
      local_140 = data;
      do {
        iVar3 = __isoc99_sscanf(pcVar11,"%u,%u,%u,%u,%u,%u",&local_138,(long)&local_138 + 4,
                                &uStack_130,(long)&uStack_130 + 4,&local_160,auStack_15c);
        if (iVar3 == 6) {
          bVar14 = *pcVar11 == '\0';
          goto LAB_0054abbb;
        }
        pcVar1 = pcVar11 + 1;
        pcVar11 = pcVar11 + 1;
      } while (*pcVar1 != '\0');
      bVar14 = true;
LAB_0054abbb:
      uVar7 = local_138 & 0xffffffff;
      uVar6 = local_138 >> 0x20;
      uVar9 = uStack_130 & 0xffffffff;
      uVar10 = uStack_130 >> 0x20;
      bVar12 = 0xff < local_160;
      bVar13 = 0xff < auStack_15c[0];
      data = local_140;
      conn_00 = local_148;
      ftpcode = local_154;
    }
    if (((((bVar14) || (0xff < (uint)uVar7)) || (0xff < (uint)uVar6)) ||
        ((0xff < (uint)uVar9 || (0xff < (uint)uVar10)))) || ((bVar12 || (bVar13)))) {
      Curl_failf(data,"Couldn\'t interpret the 227-response");
      return CURLE_FTP_WEIRD_227_FORMAT;
    }
    if (((data->set).field_0x8e3 & 0x40) == 0) {
      pcVar11 = curl_maprintf("%u.%u.%u.%u",uVar7,uVar6,uVar9,uVar10);
    }
    else {
      Curl_infof(data,"Skip %u.%u.%u.%u for data connection, re-use %s instead");
      if (((conn_00->bits).field_0x4 & 10) == 0) {
        pcVar11 = conn_00->primary_ip;
      }
      else {
        pcVar11 = (conn_00->host).name;
      }
      pcVar11 = (*Curl_cstrdup)(pcVar11);
    }
    (conn_00->proto).ftpc.newhost = pcVar11;
    if (pcVar11 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (conn_00->proto).ftpc.newport = (short)(local_160 << 8) + (short)((ulong)_local_160 >> 0x20);
LAB_0054ace7:
    uVar8 = *(uint *)&(conn_00->bits).field_0x4;
    local_154 = ftpcode;
    if ((uVar8 & 0x20) == 0) {
      if (((uVar8 & 0x2000080) == 0x2000000) && (*pcVar11 == '\0')) {
        Curl_conninfo_remote(data,conn_00,conn_00->sock[0]);
        (*Curl_cfree)((conn_00->proto).ftpc.newhost);
        (conn_00->proto).ftpc.newhost = (char *)0x0;
        if (((conn_00->bits).field_0x4 & 10) == 0) {
          pcVar11 = conn_00->primary_ip;
        }
        else {
          pcVar11 = (conn_00->host).name;
        }
        pcVar11 = (*Curl_cstrdup)(pcVar11);
        (conn_00->proto).ftpc.newhost = pcVar11;
        if (pcVar11 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
      }
      Curl_resolv(data,pcVar11,(uint)(conn_00->proto).ftpc.newport,false,&local_150);
      uVar8 = (uint)(conn_00->proto).ftpc.newport;
      if (local_150 == (Curl_dns_entry *)0x0) {
        Curl_failf(data,"Can\'t resolve new host %s:%hu",(conn_00->proto).ftpc.newhost,(ulong)uVar8)
        ;
        return CURLE_FTP_CANT_GET_HOST;
      }
    }
    else {
      hostname = conn_00->tempaddr[(ulong)((uVar8 & 2) == 0) * 8 + 0xe];
      Curl_resolv(data,(char *)hostname,conn_00->port,false,&local_150);
      uVar8 = conn_00->port;
      if (local_150 == (Curl_dns_entry *)0x0) {
        Curl_failf(data,"Can\'t resolve proxy host %s:%hu",hostname,(ulong)(uVar8 & 0xffff));
        return CURLE_COULDNT_RESOLVE_PROXY;
      }
    }
    (conn_00->bits).tcpconnect[1] = false;
    CVar4 = Curl_connecthost(data,conn_00,local_150);
    if (CVar4 == CURLE_OK) {
      if (((data->set).field_0x8e5 & 8) != 0) {
        pcVar11 = (conn_00->proto).ftpc.newhost;
        Curl_printable_address(local_150->addr,(char *)&local_138,0x100);
        Curl_infof(data,"Connecting to %s (%s) port %d",pcVar11,&local_138,(ulong)(uVar8 & 0xffff));
      }
      Curl_resolv_unlock(data,local_150);
      (*Curl_cfree)(conn_00->secondaryhostname);
      conn_00->secondaryhostname = (char *)0x0;
      conn_00->secondary_port = (conn_00->proto).ftpc.newport;
      pcVar11 = (*Curl_cstrdup)((conn_00->proto).ftpc.newhost);
      conn_00->secondaryhostname = pcVar11;
      if (pcVar11 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      puVar2 = &(conn_00->bits).field_0x5;
      *puVar2 = *puVar2 | 0x20;
      (data->conn->proto).ftpc.state = FTP_STOP;
      return CURLE_OK;
    }
    Curl_resolv_unlock(data,local_150);
    if (local_154 != 0xe5) {
      return CVar4;
    }
    if ((conn_00->proto).ftpc.count1 == 0) {
      CVar4 = ftp_epsv_disable(data,conn_00);
      return CVar4;
    }
    return CVar4;
  }
  pcVar11 = strchr(pcVar11,0x28);
  if ((pcVar11 == (char *)0x0) ||
     (iVar3 = __isoc99_sscanf(pcVar11 + 1,"%c%c%c%u%c",&local_160,(long)&local_160 + 1,
                              (long)&local_160 + 2,&local_138,(long)&local_160 + 3), iVar3 != 5)) {
LAB_0054ab87:
    pcVar11 = "Weirdly formatted EPSV reply";
  }
  else {
    lVar5 = 1;
    do {
      if (*(char *)((long)&local_160 + lVar5) != (char)local_160) {
        if ((uint)local_138 < 0x10000) goto LAB_0054ab87;
        goto LAB_0054ab7e;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    if ((uint)local_138 < 0x10000) {
      (conn_00->proto).ftpc.newport = (unsigned_short)local_138;
      if (((conn_00->bits).field_0x4 & 10) == 0) {
        pcVar11 = conn_00->primary_ip;
      }
      else {
        pcVar11 = (conn_00->host).name;
      }
      pcVar11 = (*Curl_cstrdup)(pcVar11);
      (conn_00->proto).ftpc.newhost = pcVar11;
      if (pcVar11 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      goto LAB_0054ace7;
    }
LAB_0054ab7e:
    pcVar11 = "Illegal port number in EPSV reply";
  }
  Curl_failf(data,pcVar11);
  return CURLE_FTP_WEIRD_PASV_REPLY;
}

Assistant:

static CURLcode ftp_state_pasv_resp(struct Curl_easy *data,
                                    int ftpcode)
{
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result;
  struct Curl_dns_entry *addr = NULL;
  enum resolve_t rc;
  unsigned short connectport; /* the local port connect() should use! */
  char *str = &data->state.buffer[4];  /* start on the first letter */

  /* if we come here again, make sure the former name is cleared */
  Curl_safefree(ftpc->newhost);

  if((ftpc->count1 == 0) &&
     (ftpcode == 229)) {
    /* positive EPSV response */
    char *ptr = strchr(str, '(');
    if(ptr) {
      unsigned int num;
      char separator[4];
      ptr++;
      if(5 == sscanf(ptr, "%c%c%c%u%c",
                     &separator[0],
                     &separator[1],
                     &separator[2],
                     &num,
                     &separator[3])) {
        const char sep1 = separator[0];
        int i;

        /* The four separators should be identical, or else this is an oddly
           formatted reply and we bail out immediately. */
        for(i = 1; i<4; i++) {
          if(separator[i] != sep1) {
            ptr = NULL; /* set to NULL to signal error */
            break;
          }
        }
        if(num > 0xffff) {
          failf(data, "Illegal port number in EPSV reply");
          return CURLE_FTP_WEIRD_PASV_REPLY;
        }
        if(ptr) {
          ftpc->newport = (unsigned short)(num & 0xffff);
          ftpc->newhost = strdup(control_address(conn));
          if(!ftpc->newhost)
            return CURLE_OUT_OF_MEMORY;
        }
      }
      else
        ptr = NULL;
    }
    if(!ptr) {
      failf(data, "Weirdly formatted EPSV reply");
      return CURLE_FTP_WEIRD_PASV_REPLY;
    }
  }
  else if((ftpc->count1 == 1) &&
          (ftpcode == 227)) {
    /* positive PASV response */
    unsigned int ip[4] = {0, 0, 0, 0};
    unsigned int port[2] = {0, 0};

    /*
     * Scan for a sequence of six comma-separated numbers and use them as
     * IP+port indicators.
     *
     * Found reply-strings include:
     * "227 Entering Passive Mode (127,0,0,1,4,51)"
     * "227 Data transfer will passively listen to 127,0,0,1,4,51"
     * "227 Entering passive mode. 127,0,0,1,4,51"
     */
    while(*str) {
      if(6 == sscanf(str, "%u,%u,%u,%u,%u,%u",
                     &ip[0], &ip[1], &ip[2], &ip[3],
                     &port[0], &port[1]))
        break;
      str++;
    }

    if(!*str || (ip[0] > 255) || (ip[1] > 255)  || (ip[2] > 255)  ||
       (ip[3] > 255) || (port[0] > 255)  || (port[1] > 255) ) {
      failf(data, "Couldn't interpret the 227-response");
      return CURLE_FTP_WEIRD_227_FORMAT;
    }

    /* we got OK from server */
    if(data->set.ftp_skip_ip) {
      /* told to ignore the remotely given IP but instead use the host we used
         for the control connection */
      infof(data, "Skip %u.%u.%u.%u for data connection, re-use %s instead",
            ip[0], ip[1], ip[2], ip[3],
            conn->host.name);
      ftpc->newhost = strdup(control_address(conn));
    }
    else
      ftpc->newhost = aprintf("%u.%u.%u.%u", ip[0], ip[1], ip[2], ip[3]);

    if(!ftpc->newhost)
      return CURLE_OUT_OF_MEMORY;

    ftpc->newport = (unsigned short)(((port[0]<<8) + port[1]) & 0xffff);
  }
  else if(ftpc->count1 == 0) {
    /* EPSV failed, move on to PASV */
    return ftp_epsv_disable(data, conn);
  }
  else {
    failf(data, "Bad PASV/EPSV response: %03d", ftpcode);
    return CURLE_FTP_WEIRD_PASV_REPLY;
  }

#ifndef CURL_DISABLE_PROXY
  if(conn->bits.proxy) {
    /*
     * This connection uses a proxy and we need to connect to the proxy again
     * here. We don't want to rely on a former host lookup that might've
     * expired now, instead we remake the lookup here and now!
     */
    const char * const host_name = conn->bits.socksproxy ?
      conn->socks_proxy.host.name : conn->http_proxy.host.name;
    rc = Curl_resolv(data, host_name, (int)conn->port, FALSE, &addr);
    if(rc == CURLRESOLV_PENDING)
      /* BLOCKING, ignores the return code but 'addr' will be NULL in
         case of failure */
      (void)Curl_resolver_wait_resolv(data, &addr);

    connectport =
      (unsigned short)conn->port; /* we connect to the proxy's port */

    if(!addr) {
      failf(data, "Can't resolve proxy host %s:%hu", host_name, connectport);
      return CURLE_COULDNT_RESOLVE_PROXY;
    }
  }
  else
#endif
  {
    /* normal, direct, ftp connection */
    DEBUGASSERT(ftpc->newhost);

    /* postponed address resolution in case of tcp fastopen */
    if(conn->bits.tcp_fastopen && !conn->bits.reuse && !ftpc->newhost[0]) {
      Curl_conninfo_remote(data, conn, conn->sock[FIRSTSOCKET]);
      Curl_safefree(ftpc->newhost);
      ftpc->newhost = strdup(control_address(conn));
      if(!ftpc->newhost)
        return CURLE_OUT_OF_MEMORY;
    }

    rc = Curl_resolv(data, ftpc->newhost, ftpc->newport, FALSE, &addr);
    if(rc == CURLRESOLV_PENDING)
      /* BLOCKING */
      (void)Curl_resolver_wait_resolv(data, &addr);

    connectport = ftpc->newport; /* we connect to the remote port */

    if(!addr) {
      failf(data, "Can't resolve new host %s:%hu", ftpc->newhost, connectport);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }

  conn->bits.tcpconnect[SECONDARYSOCKET] = FALSE;
  result = Curl_connecthost(data, conn, addr);

  if(result) {
    Curl_resolv_unlock(data, addr); /* we're done using this address */
    if(ftpc->count1 == 0 && ftpcode == 229)
      return ftp_epsv_disable(data, conn);

    return result;
  }


  /*
   * When this is used from the multi interface, this might've returned with
   * the 'connected' set to FALSE and thus we are now awaiting a non-blocking
   * connect to connect.
   */

  if(data->set.verbose)
    /* this just dumps information about this second connection */
    ftp_pasv_verbose(data, addr->addr, ftpc->newhost, connectport);

  Curl_resolv_unlock(data, addr); /* we're done using this address */

  Curl_safefree(conn->secondaryhostname);
  conn->secondary_port = ftpc->newport;
  conn->secondaryhostname = strdup(ftpc->newhost);
  if(!conn->secondaryhostname)
    return CURLE_OUT_OF_MEMORY;

  conn->bits.do_more = TRUE;
  state(data, FTP_STOP); /* this phase is completed */

  return result;
}